

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_report_handler.cpp
# Opt level: O2

sc_actions sc_core::sc_report_handler::set_actions(char *msg_type_,sc_actions actions_)

{
  sc_actions sVar1;
  sc_msg_def *psVar2;
  
  psVar2 = mdlookup(msg_type_);
  if (psVar2 == (sc_msg_def *)0x0) {
    psVar2 = add_msg_type(msg_type_);
  }
  sVar1 = psVar2->actions;
  psVar2->actions = actions_;
  return sVar1;
}

Assistant:

sc_actions sc_report_handler::set_actions(const char * msg_type_,
					  sc_actions actions_)
{
    sc_msg_def * md = mdlookup(msg_type_);

    if ( !md )
	md = add_msg_type(msg_type_);

    sc_actions old = md->actions;
    md->actions = actions_;

    return old;
}